

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  _Rb_tree_header *p_Var1;
  anon_struct_576_15_8dd4ea9d_for_AutogenTarget *utilityName;
  undefined1 *puVar2;
  uint uVar3;
  pointer ppVar4;
  pointer ppVar5;
  cmGeneratorTarget *this_00;
  pointer pcVar6;
  cmLocalGenerator *pcVar7;
  string_view suffix;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var8;
  undefined1 auVar9 [8];
  undefined1 auVar10 [8];
  pointer pcVar11;
  pointer pcVar12;
  TargetType TVar13;
  long lVar14;
  string *psVar15;
  _Rb_tree_node_base *p_Var16;
  cmLinkImplementationLibraries *pcVar17;
  mapped_type *pmVar18;
  undefined8 uVar19;
  _Base_ptr p_Var20;
  cmTarget *pcVar21;
  cmGeneratorTarget *pcVar22;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> this_01;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *psVar23;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *uiFile;
  pointer filename;
  pointer __x;
  char *pcVar24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar25;
  undefined4 uVar26;
  undefined8 unaff_R12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer pbVar27;
  pointer pcVar28;
  char *pcVar29;
  pointer pcVar30;
  __node_base *p_Var31;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar32;
  pointer pcVar33;
  pointer pbVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  bool bVar36;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar37;
  string_view prefix;
  __single_object cc_3;
  __single_object cc_1;
  string timestampFileGenex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string tools;
  cmCustomCommandLines commandLines;
  string autogenComment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenByproducts;
  cmCustomCommand cc;
  cmGeneratorTarget *libTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampByproducts;
  cmCustomCommandLines timestampTargetCommandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  char timestampFileName [10];
  _Head_base<0UL,_cmCustomCommand_*,_false> local_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  cmCustomCommand *local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Rb_tree_node_base *local_4c0;
  size_t local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  undefined1 local_498 [8];
  undefined1 local_490 [8];
  undefined1 local_488 [24];
  pointer local_470;
  cmCustomCommand *local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_460;
  GenVarsT *local_458;
  undefined4 local_44c;
  GenVarsT *local_448;
  string *local_440;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_438;
  pointer local_418;
  pointer local_410;
  undefined1 local_408 [16];
  undefined1 local_3f8 [8];
  undefined1 local_3f0 [16];
  _Alloc_hider local_3e0;
  undefined1 local_3d8 [8];
  undefined1 local_3d0 [16];
  _Alloc_hider _Stack_3c0;
  size_type local_3b8;
  undefined1 local_3a8 [24];
  char *pcStack_390;
  undefined1 local_388 [32];
  undefined4 local_368;
  undefined4 uStack_364;
  pointer pcStack_360;
  pointer pcStack_358;
  pointer pcStack_350;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_348;
  pointer local_338;
  pointer ppStack_330;
  pointer local_328;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  char *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined2 local_280;
  bool local_27e;
  undefined4 local_27d;
  PolicyStatus local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  pointer local_228;
  pointer local_220;
  cmListFileBacktrace local_218;
  string local_208;
  string local_1e8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  undefined8 local_190;
  char *pcStack_188;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pointer local_60;
  undefined2 local_58;
  unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  *local_50 [2];
  unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  local_40 [2];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->OutputFiles,&(this->AutogenTarget).InfoFile);
  uVar3 = (this->QtVersion).Major;
  bVar36 = true;
  if (uVar3 < 6) {
    if (uVar3 == 5) {
      bVar36 = 0xe < (this->QtVersion).Minor;
    }
    else {
      bVar36 = false;
    }
  }
  if (bVar36) {
    (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_50);
    lVar14 = std::__cxx11::string::find((char *)local_50,0x6f6a1d,0);
    uVar26 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),lVar14 != -1);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],
                      (long)local_40[0]._M_t.
                            super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                            .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>.
                            _M_head_impl + 1);
    }
  }
  else {
    uVar26 = 0;
  }
  local_3d0._8_8_ = 0;
  _Stack_3c0._M_p = (pointer)0x0;
  local_3b8 = 0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448 = &(this->Moc).super_GenVarsT;
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    AddGeneratedSource(this,&(this->Moc).CompilationFile,local_448,true);
    if ((char)uVar26 == '\0') {
      pvVar25 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3d0 + 8);
    }
    else {
      if (this->MultiConfig == true) {
        p_Var31 = &(this->Moc).CompilationFile.Config._M_h._M_before_begin;
        while (p_Var31 = p_Var31->_M_nxt, p_Var31 != (__node_base *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_248,(value_type *)(p_Var31 + 5));
        }
        goto LAB_0024ab5f;
      }
      pvVar25 = &local_248;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar25,&(this->Moc).CompilationFileGenex);
  }
LAB_0024ab5f:
  local_458 = &(this->Uic).super_GenVarsT;
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    filename = (this->Uic).UiHeaders.
               super__Vector_base<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->Uic).UiHeaders.
             super__Vector_base<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (filename != ppVar4) {
      do {
        AddGeneratedSource(this,&filename->first,local_458,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_3d0 + 8),&filename->second);
        filename = filename + 1;
      } while (filename != ppVar4);
    }
  }
  local_418 = (pointer)local_408;
  local_410 = (pointer)0x0;
  local_408[0] = '\0';
  local_490 = (undefined1  [8])0x0;
  local_488._0_8_ = local_488._0_8_ & 0xffffffffffffff00;
  local_498 = (undefined1  [8])local_488;
  if (((GenVarsT *)&local_448->Enabled)->Enabled == true) {
    std::__cxx11::string::append(local_498);
  }
  if (((GenVarsT *)&local_458->Enabled)->Enabled == true) {
    if (local_490 != (undefined1  [8])0x0) {
      std::__cxx11::string::append(local_498);
    }
    std::__cxx11::string::append(local_498);
  }
  auVar10 = local_490;
  auVar9 = local_498;
  psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  local_3a8._0_8_ = (undefined1 *)0xa;
  local_3a8._8_8_ = "Automatic ";
  local_3a8._16_8_ = auVar10;
  pcStack_390 = (char *)auVar9;
  local_388._0_8_ = (string *)0xc;
  local_388._8_8_ = " for target ";
  local_388._24_8_ = (psVar15->_M_dataplus)._M_p;
  local_388._16_8_ = psVar15->_M_string_length;
  views._M_len = 4;
  views._M_array = (iterator)local_3a8;
  cmCatViews_abi_cxx11_((string *)local_4e0,views);
  std::__cxx11::string::operator=((string *)&local_418,(string *)local_4e0);
  if (local_4e0 != (undefined1  [8])&local_4d0) {
    operator_delete((void *)local_4e0,local_4d0._M_allocated_capacity + 1);
  }
  if (local_498 != (undefined1  [8])local_488) {
    operator_delete((void *)local_498,(ulong)(local_488._0_8_ + 1));
  }
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_44c = uVar26;
  (*this->GlobalGen->_vptr_cmGlobalGenerator[0x38])();
  pbVar34 = local_1a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_438.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar27 = local_1a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      psVar15 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_3a8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_3a8._0_8_ = psVar15->_M_string_length;
      local_3a8._16_8_ = &DAT_00000002;
      pcStack_390 = "-E";
      local_388._0_8_ = (string *)0xd;
      local_388._8_8_ = "cmake_autogen";
      local_388._24_8_ = (this->AutogenTarget).InfoFile._M_dataplus._M_p;
      local_388._16_8_ = (this->AutogenTarget).InfoFile._M_string_length;
      pcStack_360 = (pointer)(pbVar27->_M_dataplus)._M_p;
      _local_368 = pbVar27->_M_string_length;
      ilist._M_len = 5;
      ilist._M_array = (iterator)local_3a8;
      cmMakeCommandLine((cmCustomCommandLine *)local_498,ilist);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_438,(cmCustomCommandLine *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      pbVar27 = pbVar27 + 1;
    } while (pbVar27 != pbVar34);
  }
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_3a8);
  lVar14 = std::__cxx11::string::find(local_3a8,0x6f6a3c,0);
  bVar36 = lVar14 != -1;
  puVar2 = local_3a8 + 0x10;
  if ((undefined1 *)local_3a8._0_8_ != puVar2) {
    operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
  }
  if (lVar14 != -1) {
    bVar36 = (bool)(~(this->AutogenTarget).GlobalTarget & lVar14 != -1 &
                   (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count == 0);
  }
  if (bVar36 == false) {
    if ((this->AutogenTarget).DependOrigin == true) {
      local_4d0._8_8_ = &local_4d8;
      local_4d8 = (cmCustomCommand *)((ulong)local_4d8 & 0xffffffff00000000);
      local_4d0._M_allocated_capacity = 0;
      local_4b8 = 0;
      pbVar34 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_228 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_4c0 = (_Rb_tree_node_base *)local_4d0._8_8_;
      if (pbVar34 != local_228) {
        do {
          pcVar17 = cmGeneratorTarget::GetLinkImplementationLibraries(this->GenTarget,pbVar34,Link);
          if (pcVar17 != (cmLinkImplementationLibraries *)0x0) {
            pcVar30 = (pcVar17->Libraries).
                      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_220 = (pcVar17->Libraries).
                        super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            if (pcVar30 != local_220) {
              do {
                local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(pcVar30->super_cmLinkItem).Target;
                if ((cmGeneratorTarget *)
                    local_268.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (cmGeneratorTarget *)0x0) {
                  pcVar22 = this->GenTarget;
                  local_500._0_8_ =
                       local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  TVar13 = cmGeneratorTarget::GetType(pcVar22);
                  if ((TVar13 == STATIC_LIBRARY) &&
                     (TVar13 = cmGeneratorTarget::GetType((cmGeneratorTarget *)local_500._0_8_),
                     TVar13 == STATIC_LIBRARY)) {
                    local_490 = (undefined1  [8])((ulong)local_490 & 0xffffffff00000000);
                    local_488._0_8_ = (_Base_ptr)0x0;
                    local_488._8_8_ = local_490;
                    local_470 = (pointer)0x0;
                    _local_368 = 0;
                    pcStack_360 = (pointer)0x0;
                    local_388._16_8_ = (cmCustomCommand *)0x0;
                    local_388._24_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_388._0_8_ = (string *)0x0;
                    local_388._8_8_ = (char *)0x0;
                    local_3a8._16_8_ = (cmCustomCommand *)0x0;
                    pcStack_390 = (char *)0x0;
                    local_3a8._0_8_ = (undefined1 *)0x0;
                    local_3a8._8_8_ = (pointer)0x0;
                    local_488._16_8_ = local_488._8_8_;
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::_M_initialize_map((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                         *)local_3a8,0);
                    std::
                    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    ::_M_insert_unique<cmGeneratorTarget_const*const&>
                              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                *)local_498,(cmGeneratorTarget **)local_500);
                    if ((cmCustomCommand *)local_388._16_8_ == (cmCustomCommand *)(_local_368 + -8))
                    {
                      std::deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                      ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                  *)local_3a8,(cmGeneratorTarget **)local_500);
                    }
                    else {
                      (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_388._16_8_)->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start = (pointer)local_500._0_8_;
                      local_388._16_8_ = local_388._16_8_ + 8;
                    }
                    local_440 = (string *)((ulong)local_440 & 0xffffffff00000000);
                    do {
                      if (local_388._16_8_ == local_3a8._16_8_) break;
                      this_00 = *(cmGeneratorTarget **)local_3a8._16_8_;
                      if ((cmCustomCommand *)local_3a8._16_8_ ==
                          (cmCustomCommand *)(local_388._0_8_ + -8)) {
                        operator_delete(pcStack_390,0x200);
                        local_3a8._16_8_ = *(undefined8 *)(local_388._8_8_ + 8);
                        local_388._0_8_ =
                             &((cmCustomCommand *)(local_3a8._16_8_ + 0x138))->WorkingDirectory;
                        pcStack_390 = (char *)local_3a8._16_8_;
                        local_388._8_8_ = (char *)(local_388._8_8_ + 8);
                      }
                      else {
                        local_3a8._16_8_ = local_3a8._16_8_ + 8;
                      }
                      if (this_00 == pcVar22) {
                        local_440 = (string *)
                                    CONCAT44(local_440._4_4_,
                                             (int)CONCAT71((int7)((ulong)local_3a8._16_8_ >> 8),1));
                      }
                      else {
                        pcVar17 = cmGeneratorTarget::GetLinkImplementationLibraries
                                            (this_00,pbVar34,Link);
                        if (pcVar17 != (cmLinkImplementationLibraries *)0x0) {
                          pcVar6 = (pcVar17->Libraries).
                                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          for (pcVar28 = (pcVar17->Libraries).
                                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                              pcVar28 != pcVar6; pcVar28 = pcVar28 + 1) {
                            local_4b0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)(pcVar28->super_cmLinkItem).Target;
                            if ((((cmGeneratorTarget *)
                                  local_4b0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start !=
                                  (cmGeneratorTarget *)0x0) &&
                                (TVar13 = cmGeneratorTarget::GetType
                                                    ((cmGeneratorTarget *)
                                                     local_4b0.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                TVar13 == STATIC_LIBRARY)) &&
                               (pVar37 = std::
                                         _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                         ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                                   ((
                                                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                                  *)local_498,(cmGeneratorTarget **)&local_4b0),
                               ((undefined1  [16])pVar37 & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0)) {
                              if ((cmCustomCommand *)local_388._16_8_ ==
                                  (cmCustomCommand *)(_local_368 + -8)) {
                                std::
                                deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                          ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                            *)local_3a8,(cmGeneratorTarget **)&local_4b0);
                              }
                              else {
                                (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_388._16_8_)->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start =
                                     local_4b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_388._16_8_ = local_388._16_8_ + 8;
                              }
                            }
                          }
                        }
                      }
                    } while (this_00 != pcVar22);
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                    *)local_3a8);
                    std::
                    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                 *)local_498);
                    if (((ulong)local_440 & 1) != 0) goto LAB_0024b7dc;
                  }
                  pmVar18 = std::
                            map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                            ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                          *)local_4e0,(key_type *)&local_268);
                  *pmVar18 = *pmVar18 + 1;
                }
LAB_0024b7dc:
                pcVar30 = pcVar30 + 1;
              } while (pcVar30 != local_220);
            }
          }
          pbVar34 = pbVar34 + 1;
        } while (pbVar34 != local_228);
      }
      if ((_Rb_tree_node_base *)local_4d0._8_8_ != (_Rb_tree_node_base *)&local_4d8) {
        uVar19 = local_4d0._8_8_;
        do {
          if (((_Rb_tree_node_base *)(uVar19 + 0x20))->_M_parent ==
              (_Base_ptr)
              ((long)(this->ConfigsList).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->ConfigsList).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::
            _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
            ::_M_insert_unique<cmTarget*const&>
                      ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                        *)&(this->AutogenTarget).DependTargets,*(cmTarget ***)(uVar19 + 0x20));
          }
          uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
        } while ((_Rb_tree_node_base *)uVar19 != (_Rb_tree_node_base *)&local_4d8);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   *)local_4e0);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4b0,
               (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)local_3a8);
    if ((char)local_44c != '\0') {
      psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_3a8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_3a8._0_8_ = psVar15->_M_string_length;
      local_3a8._16_8_ = 0x17;
      pcStack_390 = "_autogen_timestamp_deps";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_3a8;
      cmCatViews_abi_cxx11_((string *)local_498,views_01);
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var20 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      p_Var1 = &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var20 != p_Var1) {
        do {
          pcVar21 = *(cmTarget **)(p_Var20 + 1);
          psVar15 = cmTarget::GetName_abi_cxx11_(pcVar21);
          local_4e0 = (undefined1  [8])&local_4d0;
          pcVar33 = (psVar15->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e0,pcVar33,pcVar33 + psVar15->_M_string_length);
          bVar36 = cmTarget::IsImported(pcVar21);
          if (((bVar36) &&
              (TVar13 = cmTarget::GetType(pcVar21), TVar13 < (UNKNOWN_LIBRARY|STATIC_LIBRARY))) &&
             ((0x106U >> (TVar13 & 0x1f) & 1) != 0)) {
            psVar15 = cmTarget::GetName_abi_cxx11_(pcVar21);
            pcStack_390 = (psVar15->_M_dataplus)._M_p;
            local_3a8._16_8_ = psVar15->_M_string_length;
            local_3a8._0_8_ = (undefined1 *)0x15;
            local_3a8._8_8_ = "$<TARGET_LINKER_FILE:";
            local_388._0_8_ = &DAT_00000001;
            local_388._8_8_ = ">";
            views_02._M_len = 3;
            views_02._M_array = (iterator)local_3a8;
            cmCatViews_abi_cxx11_((string *)local_500,views_02);
            std::__cxx11::string::operator=((string *)local_4e0,(string *)local_500);
            if ((cmGeneratorTarget *)local_500._0_8_ != (cmGeneratorTarget *)(local_500 + 0x10)) {
              operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4b0,(value_type *)local_4e0);
          if (local_4e0 != (undefined1  [8])&local_4d0) {
            operator_delete((void *)local_4e0,local_4d0._M_allocated_capacity + 1);
          }
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
        } while ((_Rb_tree_header *)p_Var20 != p_Var1);
      }
      std::make_unique<cmCustomCommand>();
      pcVar33 = (this->Dir).Work._M_dataplus._M_p;
      if (pcVar33 == (pointer)0x0) {
        pcVar33 = "";
      }
      pcVar29 = (char *)((local_508._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar15 = &(local_508._M_head_impl)->WorkingDirectory;
      strlen(pcVar33);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar29,(ulong)pcVar33);
      _Var8._M_head_impl = local_508._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c0,&local_268);
      cmCustomCommand::SetByproducts(_Var8._M_head_impl,&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      _Var8._M_head_impl = local_508._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_d8,&local_4b0);
      cmCustomCommand::SetDepends(_Var8._M_head_impl,&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      _Var8._M_head_impl = local_508._M_head_impl;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                (&local_f0,&local_1c8);
      cmCustomCommand::SetCommandLines(_Var8._M_head_impl,(cmCustomCommandLines *)&local_f0);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_f0);
      cmCustomCommand::SetCMP0116Status(local_508._M_head_impl,NEW);
      cmCustomCommand::SetEscapeOldStyle(local_508._M_head_impl,false);
      local_3d8 = (undefined1  [8])local_508._M_head_impl;
      local_508._M_head_impl = (cmCustomCommand *)0x0;
      pcVar21 = cmLocalGenerator::AddUtilityCommand
                          (this->LocalGen,(string *)local_498,true,
                           (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                           local_3d8);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_3d8);
      pcVar7 = this->LocalGen;
      pcVar22 = (cmGeneratorTarget *)operator_new(0x8c0);
      cmGeneratorTarget::cmGeneratorTarget(pcVar22,pcVar21,pcVar7);
      local_3e0._M_p = (pointer)pcVar22;
      cmLocalGenerator::AddGeneratorTarget
                (pcVar7,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        &local_3e0);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                 &local_3e0);
      if ((this->TargetsFolder)._M_string_length != 0) {
        local_3a8._0_8_ = local_3a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"FOLDER","");
        cmTarget::SetProperty(pcVar21,(string *)local_3a8,(cmValue)&this->TargetsFolder);
        if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
          operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
        }
      }
      pbVar34 = local_4b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar35 = &(local_4b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          if (paVar35 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((cmGeneratorTarget *)(paVar35 + -1))->Target) {
            operator_delete(((cmGeneratorTarget *)(paVar35 + -1))->Target,
                            (ulong)((long)&((cmLocalGenerator *)paVar35->_M_allocated_capacity)->
                                           _vptr_cmLocalGenerator + 1));
          }
          pcVar22 = (cmGeneratorTarget *)(paVar35 + 1);
          paVar35 = paVar35 + 2;
        } while (pcVar22 !=
                 (cmGeneratorTarget *)
                 local_4b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        local_4b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar34;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4b0,(value_type *)local_498);
      anon_unknown.dwarf_77e1a7::AddAutogenExecutableToDependencies(local_448,&local_4b0);
      anon_unknown.dwarf_77e1a7::AddAutogenExecutableToDependencies(local_458,&local_4b0);
      local_60 = (pointer)0x6d617473656d6974;
      local_58 = 0x70;
      local_3a8._8_8_ = (this->Dir).Build._M_dataplus._M_p;
      local_3a8._0_8_ = (this->Dir).Build._M_string_length;
      local_3a8._16_8_ = 1;
      pcStack_390 = (char *)((long)"in Json::Value::setComment(): Comments must start with /" + 0x37
                            );
      local_388._0_8_ = strlen((char *)&local_60);
      views_03._M_len = 3;
      views_03._M_array = (iterator)local_3a8;
      local_388._8_8_ = &local_60;
      cmCatViews_abi_cxx11_((string *)local_4e0,views_03);
      local_3a8._8_8_ = (this->Dir).Build._M_dataplus._M_p;
      local_3a8._0_8_ = (this->Dir).Build._M_string_length;
      local_3a8._16_8_ = 5;
      pcStack_390 = "/deps";
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_3a8;
      cmCatViews_abi_cxx11_((string *)local_500,views_04);
      local_440 = &(this->AutogenTarget).DepFile;
      std::__cxx11::string::operator=((string *)local_440,(string *)local_500);
      if ((cmGeneratorTarget *)local_500._0_8_ != (cmGeneratorTarget *)(local_500 + 0x10)) {
        operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
      }
      local_3a8._8_8_ = (this->Dir).RelativeBuild._M_dataplus._M_p;
      local_3a8._0_8_ = (this->Dir).RelativeBuild._M_string_length;
      local_3a8._16_8_ = 1;
      pcStack_390 = (char *)((long)"in Json::Value::setComment(): Comments must start with /" + 0x37
                            );
      local_388._0_8_ = strlen((char *)&local_60);
      views_05._M_len = 3;
      views_05._M_array = (iterator)local_3a8;
      local_388._8_8_ = &local_60;
      cmCatViews_abi_cxx11_((string *)local_500,views_05);
      std::__cxx11::string::operator=
                ((string *)&(this->AutogenTarget).DepFileRuleName,(string *)local_500);
      if ((cmGeneratorTarget *)local_500._0_8_ != (cmGeneratorTarget *)(local_500 + 0x10)) {
        operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
      }
      psVar15 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_3a8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_3a8._0_8_ = psVar15->_M_string_length;
      local_3a8._16_8_ = &DAT_00000002;
      pcStack_390 = "-E";
      local_388._0_8_ = (string *)0x5;
      local_388._8_8_ = "touch";
      local_388._16_8_ = local_4d8;
      local_388._24_8_ = local_4e0;
      ilist_01._M_len = 4;
      ilist_01._M_array = (iterator)local_3a8;
      cmMakeCommandLine((cmCustomCommandLine *)local_500,ilist_01);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_438,(cmCustomCommandLine *)local_500);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_500);
      AddGeneratedSource(this,(string *)local_4e0,local_448,false);
      std::make_unique<cmCustomCommand>();
      uVar19 = local_3a8._0_8_;
      _Var8._M_head_impl = local_508._M_head_impl;
      local_3a8._0_8_ = (undefined1 *)0x0;
      local_508._M_head_impl = (cmCustomCommand *)uVar19;
      if (_Var8._M_head_impl != (cmCustomCommand *)0x0) {
        cmCustomCommand::~cmCustomCommand(_Var8._M_head_impl);
        operator_delete(_Var8._M_head_impl,0x138);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_3a8);
      _Var8._M_head_impl = local_508._M_head_impl;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_4e0,
                 (pointer)((long)&(local_4d8->Outputs).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)local_4e0));
      cmCustomCommand::SetOutputs(_Var8._M_head_impl,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      _Var8._M_head_impl = local_508._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_108,&local_248);
      cmCustomCommand::SetByproducts(_Var8._M_head_impl,&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      _Var8._M_head_impl = local_508._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_120,&local_4b0);
      cmCustomCommand::SetDepends(_Var8._M_head_impl,&local_120);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_120);
      _Var8._M_head_impl = local_508._M_head_impl;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                (&local_138,&local_438);
      cmCustomCommand::SetCommandLines(_Var8._M_head_impl,(cmCustomCommandLines *)&local_138);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_138);
      cmCustomCommand::SetComment(local_508._M_head_impl,(char *)local_418);
      pcVar33 = (this->Dir).Work._M_dataplus._M_p;
      pcVar29 = "";
      if (pcVar33 != (pointer)0x0) {
        pcVar29 = pcVar33;
      }
      pcVar24 = (char *)((local_508._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar15 = &(local_508._M_head_impl)->WorkingDirectory;
      strlen(pcVar29);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar24,(ulong)pcVar29);
      cmCustomCommand::SetCMP0116Status(local_508._M_head_impl,NEW);
      cmCustomCommand::SetEscapeOldStyle(local_508._M_head_impl,false);
      cmCustomCommand::SetDepfile(local_508._M_head_impl,local_440);
      (local_508._M_head_impl)->StdPipesUTF8 = true;
      local_3f0._8_8_ = local_508._M_head_impl;
      local_508._M_head_impl = (cmCustomCommand *)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                 (local_3f0 + 8),false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                 (local_3f0 + 8));
      pbVar27 = local_4b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar34 = local_4b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar35 = &(local_4b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          if (paVar35 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((cmGeneratorTarget *)(paVar35 + -1))->Target) {
            operator_delete(((cmGeneratorTarget *)(paVar35 + -1))->Target,
                            (ulong)((long)&((cmLocalGenerator *)paVar35->_M_allocated_capacity)->
                                           _vptr_cmLocalGenerator + 1));
          }
          pcVar22 = (cmGeneratorTarget *)(paVar35 + 1);
          paVar35 = paVar35 + 2;
        } while (pcVar22 != (cmGeneratorTarget *)pbVar27);
        local_4b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar34;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4b0,(value_type *)local_4e0);
      pcVar12 = local_438.
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pcVar11 = local_438.
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pvVar25 = &(local_438.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      if (local_438.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_438.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pvVar25);
          pvVar25 = pvVar25 + 1;
        } while (pvVar25 !=
                 &pcVar12->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        local_438.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar11;
      }
      local_410 = (pointer)0x0;
      *(char *)&(local_418->first)._M_dataplus._M_p = '\0';
      if (local_4e0 != (undefined1  [8])&local_4d0) {
        operator_delete((void *)local_4e0,local_4d0._M_allocated_capacity + 1);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_508);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      if (local_498 != (undefined1  [8])local_488) {
        operator_delete((void *)local_498,(ulong)(local_488._0_8_ + 1));
      }
    }
    std::make_unique<cmCustomCommand>();
    pcVar33 = (this->Dir).Work._M_dataplus._M_p;
    pcVar29 = "";
    if (pcVar33 != (pointer)0x0) {
      pcVar29 = pcVar33;
    }
    pcVar24 = *(char **)((long)local_498 + 0xd0);
    psVar15 = (string *)((long)local_498 + 200);
    strlen(pcVar29);
    std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar24,(ulong)pcVar29);
    auVar9 = local_498;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_150,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_3d0 + 8));
    cmCustomCommand::SetByproducts((cmCustomCommand *)auVar9,&local_150);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_150);
    auVar9 = local_498;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_168,&local_4b0);
    cmCustomCommand::SetDepends((cmCustomCommand *)auVar9,&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168);
    auVar9 = local_498;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_180,&local_438);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)auVar9,(cmCustomCommandLines *)&local_180);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_180);
    cmCustomCommand::SetCMP0116Status((cmCustomCommand *)local_498,NEW);
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_498,false);
    cmCustomCommand::SetComment((cmCustomCommand *)local_498,(char *)local_418);
    utilityName = &this->AutogenTarget;
    local_3f0._0_8_ = local_498;
    local_498 = (undefined1  [8])0x0;
    pcVar21 = cmLocalGenerator::AddUtilityCommand
                        (this->LocalGen,&utilityName->Name,true,
                         (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                         local_3f0);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_3f0);
    pcVar7 = this->LocalGen;
    this_01.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         (__uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>)
         operator_new(0x8c0);
    cmGeneratorTarget::cmGeneratorTarget
              ((cmGeneratorTarget *)
               this_01.
               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
               super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,pcVar21,pcVar7);
    local_3f8 = (undefined1  [8])
                this_01.
                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
    cmLocalGenerator::AddGeneratorTarget
              (pcVar7,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                      local_3f8);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)local_3f8);
    if ((this->AutogenTarget).DependOrigin == true) {
      psVar23 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->GenTarget);
      for (p_Var16 = (psVar23->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var16 != &(psVar23->_M_t)._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        cmTarget::AddUtility(pcVar21,(string *)(p_Var16 + 1),false,this->Makefile);
      }
    }
    if ((char)local_44c == '\0') {
      for (p_Var16 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_left;
          (_Rb_tree_header *)p_Var16 !=
          &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        psVar15 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var16 + 1));
        cmTarget::AddUtility(pcVar21,psVar15,false,this->Makefile);
      }
    }
    if ((this->TargetsFolder)._M_string_length != 0) {
      local_3a8._0_8_ = local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"FOLDER","");
      cmTarget::SetProperty(pcVar21,(string *)local_3a8,(cmValue)&this->TargetsFolder);
      if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
        operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
      }
    }
    cmTarget::AddUtility(this->GenTarget->Target,&utilityName->Name,false,this->Makefile);
    if ((this->AutogenTarget).GlobalTarget == true) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,this->LocalGen,&utilityName->Name);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_498);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4b0);
  }
  else {
    for (p_Var16 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var16 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      pcVar21 = this->GenTarget->Target;
      psVar15 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var16 + 1));
      cmTarget::AddUtility(pcVar21,psVar15,false,this->Makefile);
    }
    if (((this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_388._0_8_ = &pcStack_358;
      local_3a8._8_8_ = (pointer)0x0;
      local_3a8._16_8_ = local_3a8._16_8_ & 0xffffffffffffff00;
      local_388._8_8_ = &DAT_00000001;
      local_388._16_8_ = (_Hash_node_base *)0x0;
      local_388._24_8_ = 0;
      uStack_364 = (undefined4)((ulong)_local_368 >> 0x20);
      local_368 = 0x3f800000;
      pcStack_360 = (pointer)0x0;
      pcStack_358 = (pointer)0x0;
      local_4e0 = (undefined1  [8])&local_4d0;
      local_4d8 = (cmCustomCommand *)0x0;
      local_4d0._M_allocated_capacity = local_4d0._M_allocated_capacity & 0xffffffffffffff00;
      local_490 = (undefined1  [8])(this->Dir).Build._M_dataplus._M_p;
      local_498 = (undefined1  [8])(this->Dir).Build._M_string_length;
      local_488._0_8_ = (_Base_ptr)0x8;
      local_488._8_8_ = "/autouic";
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_498;
      local_3a8._0_8_ = puVar2;
      cmCatViews_abi_cxx11_((string *)local_500,views_00);
      local_190 = 6;
      pcStack_188 = ".stamp";
      suffix._M_str = ".stamp";
      suffix._M_len = 6;
      prefix._M_str = (char *)local_500._0_8_;
      prefix._M_len = local_500._8_8_;
      ConfigFileNamesAndGenex(this,(ConfigString *)local_3a8,(string *)local_4e0,prefix,suffix);
      if ((cmGeneratorTarget *)local_500._0_8_ != (cmGeneratorTarget *)(local_500 + 0x10)) {
        operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
      }
      AddGeneratedSource(this,(ConfigString *)local_3a8,local_458,false);
      psVar15 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_490 = (undefined1  [8])(psVar15->_M_dataplus)._M_p;
      local_498 = (undefined1  [8])psVar15->_M_string_length;
      local_488._0_8_ = &DAT_00000002;
      local_488._8_8_ = "-E";
      local_488._16_8_ = (pointer)0x5;
      local_470 = (pointer)0x6f6a5a;
      local_468 = local_4d8;
      local_460 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e0;
      ilist_00._M_len = 4;
      ilist_00._M_array = (iterator)local_498;
      cmMakeCommandLine((cmCustomCommandLine *)local_500,ilist_00);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_438,(cmCustomCommandLine *)local_500);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_500);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_498,&(this->Uic).UiFilesNoOptions);
      __x = (this->Uic).UiFilesWithOptions.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (this->Uic).UiFilesWithOptions.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__x != ppVar5) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_498,&__x->first);
          __x = __x + 1;
        } while (__x != ppVar5);
      }
      anon_unknown.dwarf_77e1a7::AddAutogenExecutableToDependencies
                (local_458,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_498);
      std::make_unique<cmCustomCommand>();
      uVar19 = local_500._0_8_;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_4e0,
                 (pointer)((long)&(local_4d8->Outputs).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)local_4e0));
      cmCustomCommand::SetOutputs((cmCustomCommand *)uVar19,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      uVar19 = local_500._0_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_78,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_498);
      cmCustomCommand::SetDepends((cmCustomCommand *)uVar19,&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      cmCustomCommand::SetComment((cmCustomCommand *)local_500._0_8_,"");
      pcVar29 = (this->Dir).Work._M_dataplus._M_p;
      pcVar24 = "";
      if (pcVar29 != (char *)0x0) {
        pcVar24 = pcVar29;
      }
      pcVar29 = *(char **)&((_Rb_tree_header *)(local_500._0_8_ + 0xd0))->_M_header;
      psVar32 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_500._0_8_ + 200);
      strlen(pcVar24);
      std::__cxx11::string::_M_replace((ulong)psVar32,0,pcVar29,(ulong)pcVar24);
      cmCustomCommand::SetCMP0116Status((cmCustomCommand *)local_500._0_8_,NEW);
      cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_500._0_8_,false);
      *(bool *)(local_500._0_8_ + 0x12d) = true;
      local_3d0._0_8_ = local_500._0_8_;
      local_500._0_8_ = (cmGeneratorTarget *)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_3d0,
                 false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_3d0);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_500);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      if (local_4e0 != (undefined1  [8])&local_4d0) {
        operator_delete((void *)local_4e0,local_4d0._M_allocated_capacity + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_388);
      if ((undefined1 *)local_3a8._0_8_ != puVar2) {
        operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
      }
    }
    pcStack_358 = (pointer)0x0;
    pcStack_350 = (pointer)0x0;
    _local_368 = 0;
    pcStack_360 = (pointer)0x0;
    local_388._16_8_ = (cmCustomCommand *)0x0;
    local_388._24_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_388._0_8_ = (string *)0x0;
    local_388._8_8_ = (char *)0x0;
    local_3a8._16_8_ = (cmCustomCommand *)0x0;
    pcStack_390 = (char *)0x0;
    local_3a8._0_8_ = (undefined1 *)0x0;
    local_3a8._8_8_ = (pointer)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_348);
    local_320._M_p = (pointer)&local_310;
    local_338 = (pointer)0x0;
    ppStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    local_318 = 0;
    local_310._M_local_buf[0] = '\0';
    local_300._M_p = (pointer)&local_2f0;
    local_2f8 = 0;
    local_2f0._M_local_buf[0] = '\0';
    local_2e0._M_p = (pointer)&local_2d0;
    local_2d8 = (char *)0x0;
    local_2d0._M_local_buf[0] = '\0';
    local_2c0._M_p = (pointer)&local_2b0;
    local_2b8 = 0;
    local_2b0._M_local_buf[0] = '\0';
    local_2a0._M_p = (pointer)&local_290;
    local_298 = 0;
    local_290._M_local_buf[0] = '\0';
    local_280._0_1_ = false;
    local_280._1_1_ = false;
    local_27e = true;
    local_27d._0_1_ = false;
    local_27d._1_1_ = false;
    local_27d._2_1_ = false;
    local_27d._3_1_ = false;
    local_278 = WARN;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_90,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_3d0 + 8));
    cmCustomCommand::SetByproducts((cmCustomCommand *)local_3a8,&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_a8,&local_438);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)local_3a8,(cmCustomCommandLines *)&local_a8)
    ;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_a8);
    cmCustomCommand::SetComment((cmCustomCommand *)local_3a8,(char *)local_418);
    cmMakefile::GetBacktrace(this->Makefile);
    cmCustomCommand::SetBacktrace((cmCustomCommand *)local_3a8,&local_218);
    if (local_218.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_218.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pcVar29 = local_2d8;
    pcVar33 = (this->Dir).Work._M_dataplus._M_p;
    pcVar24 = "";
    if (pcVar33 != (pointer)0x0) {
      pcVar24 = pcVar33;
    }
    strlen(pcVar24);
    std::__cxx11::string::_M_replace((ulong)&local_2e0,0,pcVar29,(ulong)pcVar24);
    local_27d._2_1_ = true;
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_3a8,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_3a8,true);
    cmTarget::AddPreBuildCommand(this->GenTarget->Target,(cmCustomCommand *)local_3a8);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_3a8);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_438);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  if (local_418 != (pointer)local_408) {
    operator_delete(local_418,CONCAT71(local_408._1_7_,local_408[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_3d0 + 8));
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  // Register info file as generated by CMake
  this->Makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Determine whether to use a depfile for the AUTOGEN target.
  const bool useNinjaDepfile = this->QtVersion >= IntegerVersion(5, 15) &&
    this->GlobalGen->GetName().find("Ninja") != std::string::npos;

  // Files provided by the autogen target
  std::vector<std::string> autogenByproducts;
  std::vector<std::string> timestampByproducts;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.CompilationFile, this->Moc, true);
    if (useNinjaDepfile) {
      if (this->MultiConfig) {
        // Make all mocs_compilation_<CONFIG>.cpp files byproducts of the
        // ${target}_autogen/timestamp custom command.
        // We cannot just use Moc.CompilationFileGenex here, because that
        // custom command runs cmake_autogen for each configuration.
        for (const auto& p : this->Moc.CompilationFile.Config) {
          timestampByproducts.push_back(p.second);
        }
      } else {
        timestampByproducts.push_back(this->Moc.CompilationFileGenex);
      }
    } else {
      autogenByproducts.push_back(this->Moc.CompilationFileGenex);
    }
  }

  if (this->Uic.Enabled) {
    for (const auto& file : this->Uic.UiHeaders) {
      this->AddGeneratedSource(file.first, this->Uic);
      autogenByproducts.push_back(file.second);
    }
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = cmStrCat("Automatic ", tools, " for target ",
                              this->GenTarget->GetName());
  }

  // Compose command lines
  // FIXME: Take advantage of our per-config mocs_compilation_$<CONFIG>.cpp
  // instead of fiddling with the include directories
  std::vector<std::string> configs;
  this->GlobalGen->GetQtAutoGenConfigs(configs);
  bool stdPipesUTF8 = true;
  cmCustomCommandLines commandLines;
  for (auto const& config : configs) {
    commandLines.push_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", "cmake_autogen",
        this->AutogenTarget.InfoFile, config }));
  }

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (this->GlobalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (this->AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      this->GenTarget->Target->AddUtility(depTarget->GetName(), false,
                                          this->Makefile);
    }

    if (!this->Uic.UiFilesNoOptions.empty() ||
        !this->Uic.UiFilesWithOptions.empty()) {
      // Add a generated timestamp file
      ConfigString timestampFile;
      std::string timestampFileGenex;
      ConfigFileNamesAndGenex(timestampFile, timestampFileGenex,
                              cmStrCat(this->Dir.Build, "/autouic"_s),
                              ".stamp"_s);
      this->AddGeneratedSource(timestampFile, this->Uic);

      // Add a step in the pre-build command to touch the timestamp file
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "touch",
                            timestampFileGenex }));

      // UIC needs to be re-run if any of the known UI files change or the
      // executable itself has been updated
      auto uicDependencies = this->Uic.UiFilesNoOptions;
      for (auto const& uiFile : this->Uic.UiFilesWithOptions) {
        uicDependencies.push_back(uiFile.first);
      }
      AddAutogenExecutableToDependencies(this->Uic, uicDependencies);

      // Add a rule file to cause the target to build if a dependency has
      // changed, which will trigger the pre-build command to run autogen
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(timestampFileGenex);
      cc->SetDepends(uicDependencies);
      cc->SetComment("");
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    cmCustomCommand cc;
    cc.SetByproducts(autogenByproducts);
    cc.SetCommandLines(commandLines);
    cc.SetComment(autogenComment.c_str());
    cc.SetBacktrace(this->Makefile->GetBacktrace());
    cc.SetWorkingDirectory(this->Dir.Work.c_str());
    cc.SetStdPipesUTF8(stdPipesUTF8);
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->GenTarget->Target->AddPreBuildCommand(std::move(cc));
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->GenTarget->GetLinkImplementationLibraries(
            config, cmGeneratorTarget::LinkInterfaceFor::Link);
        if (libs) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if (libTarget &&
                !StaticLibraryCycle(this->GenTarget, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    std::vector<std::string> dependencies(
      this->AutogenTarget.DependFiles.begin(),
      this->AutogenTarget.DependFiles.end());

    if (useNinjaDepfile) {
      // Create a custom command that generates a timestamp file and
      // has a depfile assigned. The depfile is created by JobDepFilesMergeT.
      //
      // Also create an additional '_autogen_timestamp_deps' that the custom
      // command will depend on. It will have no sources or commands to
      // execute, but it will have dependencies that would originally be
      // assigned to the pre-Qt 5.15 'autogen' target. These dependencies will
      // serve as a list of order-only dependencies for the custom command,
      // without forcing the custom command to re-execute.
      //
      // The dependency tree would then look like
      // '_autogen_timestamp_deps (order-only)' <- '/timestamp' file <-
      // '_autogen' target.
      const auto timestampTargetName =
        cmStrCat(this->GenTarget->GetName(), "_autogen_timestamp_deps");
      std::vector<std::string> timestampTargetProvides;
      cmCustomCommandLines timestampTargetCommandLines;

      // Add additional autogen target dependencies to
      // '_autogen_timestamp_deps'.
      for (const cmTarget* t : this->AutogenTarget.DependTargets) {
        std::string depname = t->GetName();
        if (t->IsImported()) {
          auto ttype = t->GetType();
          if (ttype == cmStateEnums::TargetType::STATIC_LIBRARY ||
              ttype == cmStateEnums::TargetType::SHARED_LIBRARY ||
              ttype == cmStateEnums::TargetType::UNKNOWN_LIBRARY) {
            depname = cmStrCat("$<TARGET_LINKER_FILE:", t->GetName(), ">");
          }
        }
        dependencies.push_back(depname);
      }

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetByproducts(timestampTargetProvides);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(timestampTargetCommandLines);
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cmTarget* timestampTarget = this->LocalGen->AddUtilityCommand(
        timestampTargetName, true, std::move(cc));
      this->LocalGen->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(timestampTarget, this->LocalGen));

      // Set FOLDER property on the timestamp target, so it appears in the
      // appropriate folder in an IDE or in the file api.
      if (!this->TargetsFolder.empty()) {
        timestampTarget->SetProperty("FOLDER", this->TargetsFolder);
      }

      // Make '/timestamp' file depend on '_autogen_timestamp_deps' and on the
      // moc and uic executables (whichever are enabled).
      dependencies.clear();
      dependencies.push_back(timestampTargetName);

      AddAutogenExecutableToDependencies(this->Moc, dependencies);
      AddAutogenExecutableToDependencies(this->Uic, dependencies);

      // Create the custom command that outputs the timestamp file.
      const char timestampFileName[] = "timestamp";
      const std::string outputFile =
        cmStrCat(this->Dir.Build, "/", timestampFileName);
      this->AutogenTarget.DepFile = cmStrCat(this->Dir.Build, "/deps");
      this->AutogenTarget.DepFileRuleName =
        cmStrCat(this->Dir.RelativeBuild, "/", timestampFileName);
      commandLines.push_back(cmMakeCommandLine(
        { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));

      this->AddGeneratedSource(outputFile, this->Moc);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(outputFile);
      cc->SetByproducts(timestampByproducts);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(commandLines);
      cc->SetComment(autogenComment.c_str());
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cc->SetDepfile(this->AutogenTarget.DepFile);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));

      // Alter variables for the autogen target which now merely wraps the
      // custom command
      dependencies.clear();
      dependencies.push_back(outputFile);
      commandLines.clear();
      autogenComment.clear();
    }

    // Create autogen target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(this->Dir.Work.c_str());
    cc->SetByproducts(autogenByproducts);
    cc->SetDepends(dependencies);
    cc->SetCommandLines(commandLines);
    cc->SetCMP0116Status(cmPolicies::NEW);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(autogenComment.c_str());
    cmTarget* autogenTarget = this->LocalGen->AddUtilityCommand(
      this->AutogenTarget.Name, true, std::move(cc));
    // Create autogen generator target
    this->LocalGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(autogenTarget, this->LocalGen));

    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::pair<std::string, bool>> const& depName :
           this->GenTarget->GetUtilities()) {
        autogenTarget->AddUtility(depName.Value.first, false, this->Makefile);
      }
    }
    if (!useNinjaDepfile) {
      // Add additional autogen target dependencies to autogen target
      for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
        autogenTarget->AddUtility(depTarget->GetName(), false, this->Makefile);
      }
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder);
    }

    // Add autogen target to the origin target dependencies
    this->GenTarget->Target->AddUtility(this->AutogenTarget.Name, false,
                                        this->Makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(this->LocalGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}